

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DebugCheckVersionAndDataLayout
               (char *version,size_t sz_io,size_t sz_style,size_t sz_vec2,size_t sz_vec4,
               size_t sz_vert,size_t sz_idx)

{
  int iVar1;
  
  iVar1 = strcmp(version,"1.86 WIP");
  if (iVar1 != 0) {
    __assert_fail("strcmp(version, \"1.86 WIP\") == 0 && \"Mismatched version string!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1e98,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_io != 0x1558) {
    __assert_fail("sz_io == sizeof(ImGuiIO) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1e99,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_style != 0x438) {
    __assert_fail("sz_style == sizeof(ImGuiStyle) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1e9a,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if (sz_vec2 == 8) {
    if (sz_vec4 != 0x10) {
      __assert_fail("sz_vec4 == sizeof(ImVec4) && \"Mismatched struct layout!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1e9c,
                    "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
    if (sz_vert == 0x14) {
      if (sz_idx == 2) {
        return true;
      }
      __assert_fail("sz_idx == sizeof(ImDrawIdx) && \"Mismatched struct layout!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1e9e,
                    "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
    __assert_fail("sz_vert == sizeof(ImDrawVert) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1e9d,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  __assert_fail("sz_vec2 == sizeof(ImVec2) && \"Mismatched struct layout!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x1e9b,
                "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
               );
}

Assistant:

bool ImGui::DebugCheckVersionAndDataLayout(const char* version, size_t sz_io, size_t sz_style, size_t sz_vec2, size_t sz_vec4, size_t sz_vert, size_t sz_idx)
{
    bool error = false;
    if (strcmp(version, IMGUI_VERSION) != 0) { error = true; IM_ASSERT(strcmp(version, IMGUI_VERSION) == 0 && "Mismatched version string!"); }
    if (sz_io != sizeof(ImGuiIO)) { error = true; IM_ASSERT(sz_io == sizeof(ImGuiIO) && "Mismatched struct layout!"); }
    if (sz_style != sizeof(ImGuiStyle)) { error = true; IM_ASSERT(sz_style == sizeof(ImGuiStyle) && "Mismatched struct layout!"); }
    if (sz_vec2 != sizeof(ImVec2)) { error = true; IM_ASSERT(sz_vec2 == sizeof(ImVec2) && "Mismatched struct layout!"); }
    if (sz_vec4 != sizeof(ImVec4)) { error = true; IM_ASSERT(sz_vec4 == sizeof(ImVec4) && "Mismatched struct layout!"); }
    if (sz_vert != sizeof(ImDrawVert)) { error = true; IM_ASSERT(sz_vert == sizeof(ImDrawVert) && "Mismatched struct layout!"); }
    if (sz_idx != sizeof(ImDrawIdx)) { error = true; IM_ASSERT(sz_idx == sizeof(ImDrawIdx) && "Mismatched struct layout!"); }
    return !error;
}